

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1c4ce03::EntriesProcessing::IncludeEntry
          (EntriesProcessing *this,LinkEntry *entry)

{
  TargetType TVar1;
  bool local_29;
  LinkEntry *entry_local;
  EntriesProcessing *this_local;
  
  if (this->Unicity == None) {
    return true;
  }
  if (this->Unicity == Shared) {
    if (entry->Target == (cmGeneratorTarget *)0x0) {
      return true;
    }
    TVar1 = cmGeneratorTarget::GetType(entry->Target);
    if (TVar1 != SHARED_LIBRARY) {
      return true;
    }
  }
  local_29 = false;
  if (this->Unicity == All) {
    local_29 = entry->Kind != Library;
  }
  return local_29;
}

Assistant:

bool IncludeEntry(LinkEntry const& entry) const
  {
    return this->Unicity == None ||
      (this->Unicity == Shared &&
       (entry.Target == nullptr ||
        entry.Target->GetType() != cmStateEnums::SHARED_LIBRARY)) ||
      (this->Unicity == All && entry.Kind != LinkEntry::Library);
  }